

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep_test.c
# Opt level: O0

void test_rep_close_context_send(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_msg *msg;
  nng_err result__19;
  nng_err result__18;
  nng_err result__17;
  nng_err result__16;
  int rv;
  nng_err result__15;
  nng_err result__14;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  int i;
  nng_aio *aio [100];
  nng_ctx ctx [100];
  nng_msg *m;
  nng_socket req;
  nng_socket rep;
  
  nVar1 = nng_rep0_open((nng_socket *)((long)&m + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1d9,"%s: expected success, got %s (%d)","nng_rep0_open(&rep)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_req0_open_raw((nng_socket *)&m);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1da,"%s: expected success, got %s (%d)","nng_req0_open_raw(&req)",pcVar3
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  for (result__1 = NNG_OK; (int)result__1 < 100; result__1 = result__1 + NNG_EINTR) {
    nVar1 = nng_ctx_open(ctx + (long)(int)result__1 + -2,m._4_4_);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x1dc,"%s: expected success, got %s (%d)","nng_ctx_open(&ctx[i], rep)",
                           pcVar3,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    nVar1 = nng_aio_alloc((nng_aio **)(&result_ + (long)(int)result__1 * 2),
                          (_func_void_void_ptr *)0x0,(void *)0x0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x1dd,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&aio[i], NULL, NULL)",pcVar3,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
  }
  nVar1 = nng_socket_set_ms(m._4_4_,"recv-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1df,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(m._4_4_,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1e0,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(m._0_4_,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1e1,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(m._4_4_,"send-buffer",1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1e2,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(rep, NNG_OPT_SENDBUF, 1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(m._4_4_,"recv-buffer",1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1e3,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(rep, NNG_OPT_RECVBUF, 1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(m._0_4_,"send-buffer",1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1e4,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(req, NNG_OPT_SENDBUF, 1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(m._0_4_,"recv-buffer",1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1e5,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(req, NNG_OPT_RECVBUF, 1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry(m._0_4_,m._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1e7,"%s: expected success, got %s (%d)","nuts_marry(req, rep)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  result__1 = NNG_OK;
  while( true ) {
    if (99 < (int)result__1) {
      for (result__1 = NNG_OK; (int)result__1 < 100; result__1 = result__1 + NNG_EINTR) {
        nng_aio_wait(*(nng_aio **)(&result_ + (long)(int)result__1 * 2));
        nVar1 = nng_aio_result(*(nng_aio **)(&result_ + (long)(int)result__1 * 2));
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0x1f1,"%s: expected success, got %s (%d)","nng_aio_result(aio[i])",
                               pcVar3,nVar1);
        if (iVar2 == 0) {
          acutest_abort_();
        }
        ctx._392_8_ = nng_aio_get_msg(*(nng_aio **)(&result_ + (long)(int)result__1 * 2));
        acutest_check_((uint)((nng_msg *)ctx._392_8_ != (nng_msg *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                       ,0x1f2,"%s","(m = nng_aio_get_msg(aio[i])) != NULL");
        nng_aio_set_msg(*(nng_aio **)(&result_ + (long)(int)result__1 * 2),(nng_msg *)ctx._392_8_);
        nng_ctx_send((nng_ctx)ctx[(long)(int)result__1 + -2].id,
                     *(nng_aio **)(&result_ + (long)(int)result__1 * 2));
      }
      for (result__1 = NNG_OK; (int)result__1 < 100; result__1 = result__1 + NNG_EINTR) {
        nVar1 = nng_ctx_close((nng_ctx)ctx[(long)(int)result__1 + -2].id);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0x1fa,"%s: expected success, got %s (%d)","nng_ctx_close(ctx[i])",
                               pcVar3,nVar1);
        if (iVar2 == 0) {
          acutest_abort_();
        }
        nng_aio_wait(*(nng_aio **)(&result_ + (long)(int)result__1 * 2));
        num = nng_aio_result(*(nng_aio **)(&result_ + (long)(int)result__1 * 2));
        if (num != NNG_OK) {
          pcVar3 = nng_strerror(NNG_ECLOSED);
          acutest_check_((uint)(num == NNG_ECLOSED),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x1fe,"%s fails with %s","rv",pcVar3,nVar1);
          pcVar3 = nng_strerror(NNG_ECLOSED);
          pcVar4 = nng_strerror(num);
          acutest_message_("%s: expected %s (%d), got %s (%d)","rv",pcVar3,7,pcVar4,(ulong)num);
          msg = nng_aio_get_msg(*(nng_aio **)(&result_ + (long)(int)result__1 * 2));
          nng_msg_free(msg);
        }
        nng_aio_free(*(nng_aio **)(&result_ + (long)(int)result__1 * 2));
      }
      nVar1 = nng_socket_close(m._0_4_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                             ,0x203,"%s: expected success, got %s (%d)","nng_socket_close(req)",
                             pcVar3,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
      nVar1 = nng_socket_close(m._4_4_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                             ,0x204,"%s: expected success, got %s (%d)","nng_socket_close(rep)",
                             pcVar3,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
      return;
    }
    nVar1 = nng_msg_alloc((nng_msg **)(ctx + 0x62),4);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x1ea,"%s: expected success, got %s (%d)","nng_msg_alloc(&m, 4)",pcVar3,
                           nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    nVar1 = nng_msg_append_u32((nng_msg *)ctx._392_8_,result__1 | 0x80000000);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x1eb,"%s: expected success, got %s (%d)",
                           "nng_msg_append_u32(m, (unsigned) i | 0x80000000u)",pcVar3,nVar1);
    if (iVar2 == 0) break;
    nVar1 = nng_sendmsg(m._0_4_,(nng_msg *)ctx._392_8_,0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x1ec,"%s: expected success, got %s (%d)","nng_sendmsg(req, m, 0)",
                           pcVar3,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    nng_ctx_recv((nng_ctx)ctx[(long)(int)result__1 + -2].id,
                 *(nng_aio **)(&result_ + (long)(int)result__1 * 2));
    result__1 = result__1 + NNG_EINTR;
  }
  acutest_abort_();
}

Assistant:

void
test_rep_close_context_send(void)
{
	nng_socket rep;
	nng_socket req;
	nng_msg   *m;
	nng_ctx    ctx[100];
	nng_aio   *aio[100];
	int        i;

	NUTS_PASS(nng_rep0_open(&rep));
	NUTS_PASS(nng_req0_open_raw(&req));
	for (i = 0; i < 100; i++) {
		NUTS_PASS(nng_ctx_open(&ctx[i], rep));
		NUTS_PASS(nng_aio_alloc(&aio[i], NULL, NULL));
	}
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_int(rep, NNG_OPT_SENDBUF, 1));
	NUTS_PASS(nng_socket_set_int(rep, NNG_OPT_RECVBUF, 1));
	NUTS_PASS(nng_socket_set_int(req, NNG_OPT_SENDBUF, 1));
	NUTS_PASS(nng_socket_set_int(req, NNG_OPT_RECVBUF, 1));

	NUTS_MARRY(req, rep);

	for (i = 0; i < 100; i++) {
		NUTS_PASS(nng_msg_alloc(&m, 4));
		NUTS_PASS(nng_msg_append_u32(m, (unsigned) i | 0x80000000u));
		NUTS_PASS(nng_sendmsg(req, m, 0));
		nng_ctx_recv(ctx[i], aio[i]);
	}
	for (i = 0; i < 100; i++) {
		nng_aio_wait(aio[i]);
		NUTS_PASS(nng_aio_result(aio[i]));
		NUTS_TRUE((m = nng_aio_get_msg(aio[i])) != NULL);
		nng_aio_set_msg(aio[i], m);
		nng_ctx_send(ctx[i], aio[i]);
	}

	// Note that REQ socket is not reading the results.
	for (i = 0; i < 100; i++) {
		int rv;
		NUTS_PASS(nng_ctx_close(ctx[i]));
		nng_aio_wait(aio[i]);
		rv = nng_aio_result(aio[i]);
		if (rv != 0) {
			NUTS_FAIL(rv, NNG_ECLOSED);
			nng_msg_free(nng_aio_get_msg(aio[i]));
		}
		nng_aio_free(aio[i]);
	}
	NUTS_CLOSE(req);
	NUTS_CLOSE(rep);
}